

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  ostream *poVar4;
  istream *piVar5;
  ulong uVar6;
  char *pcVar7;
  string line;
  ifstream in;
  allocator local_291;
  string local_290;
  string local_270;
  ulong local_250;
  char **local_248;
  ulong local_240;
  long local_238 [65];
  
  local_248 = argv;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#include \"google/protobuf/compiler/js/well_known_types_embed.h\"\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"struct FileToc well_known_types_js[] = {\n",0x29);
  if (1 < argc) {
    uVar6 = 1;
    local_250 = (ulong)(uint)argc;
    do {
      pcVar3 = local_248[uVar6];
      local_240 = uVar6;
      std::ifstream::ifstream((istream *)local_238,pcVar3,_S_in);
      cVar2 = std::__basic_file<char>::is_open();
      pcVar1 = pcVar3;
      if (cVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Couldn\'t open input file: ",0x1a);
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::operator<<(poVar4,"\n");
        exit(1);
      }
      do {
        do {
          pcVar7 = pcVar3;
          pcVar3 = pcVar1 + 1;
          cVar2 = *pcVar1;
          pcVar1 = pcVar3;
        } while (cVar2 == '/');
        pcVar3 = pcVar7;
      } while (cVar2 != '\0');
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\"",2);
      std::__cxx11::string::string((string *)&local_270,pcVar7,&local_291);
      CEscape(&local_290,&local_270);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_290._M_dataplus._M_p,
                          local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_290,cVar2);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  \"",3);
        CEscape(&local_270,&local_290);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_270._M_dataplus._M_p,
                            local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\n\"\n",4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"},\n",3);
      std::ifstream::~ifstream((istream *)local_238);
      uVar6 = local_240 + 1;
    } while (uVar6 != local_250);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  {NULL, NULL}  // Terminate the list.\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n",3);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  std::cout << "#include "
               "\"google/protobuf/compiler/js/well_known_types_embed.h\"\n";
  std::cout << "struct FileToc well_known_types_js[] = {\n";

  for (int i = 1; i < argc; i++) {
    AddFile(argv[i], &std::cout);
  }

  std::cout << "  {NULL, NULL}  // Terminate the list.\n";
  std::cout << "};\n";

  return EXIT_SUCCESS;
}